

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::computeInitialDt
          (NavierStokesBase *this,int finest_level,int param_2,
          Vector<int,_std::allocator<int>_> *n_cycle,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *param_4,
          Vector<double,_std::allocator<double>_> *dt_level,Real stop_time)

{
  pointer piVar1;
  pointer pdVar2;
  NavierStokesBase *this_00;
  int iVar3;
  long lVar4;
  Real RVar5;
  double dVar6;
  double dVar7;
  
  if (0 < (this->super_AmrLevel).level) {
    return;
  }
  iVar3 = 1;
  dVar7 = 1e+100;
  for (lVar4 = 0; lVar4 <= finest_level; lVar4 = lVar4 + 1) {
    this_00 = getLevel(this,(int)lVar4);
    RVar5 = initialTimeStep(this_00);
    (dt_level->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar4] = RVar5;
    iVar3 = iVar3 * (n_cycle->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[lVar4];
    dVar6 = (double)iVar3 * RVar5;
    if (dVar7 <= (double)iVar3 * RVar5) {
      dVar6 = dVar7;
    }
    dVar7 = dVar6;
  }
  if (0.0 <= stop_time) {
    RVar5 = amrex::StateData::curTime
                      ((this->super_AmrLevel).state.
                       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    if (dVar7 * -0.0001 + stop_time < dVar7 + RVar5) {
      dVar7 = stop_time - RVar5;
    }
  }
  piVar1 = (n_cycle->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (dt_level->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar3 = 1;
  for (lVar4 = 0; lVar4 <= finest_level; lVar4 = lVar4 + 1) {
    iVar3 = iVar3 * piVar1[lVar4];
    pdVar2[lVar4] = dVar7 / (double)iVar3;
  }
  return;
}

Assistant:

void
NavierStokesBase::computeInitialDt (int                   finest_level,
				    int                   /*sub_cycle*/,
				    Vector<int>&           n_cycle,
				    const Vector<IntVect>& /*ref_ratio*/,
				    Vector<Real>&          dt_level,
				    Real                  stop_time)
{
    //
    // Grids have been constructed, compute dt for all levels.
    //
    if (level > 0)
        return;

    int i;

    Real dt_0    = 1.0e+100;
    int n_factor = 1;
    ///TODO/DEBUG: This will need to change for optimal subcycling.
    for (i = 0; i <= finest_level; i++)
    {
        dt_level[i] = getLevel(i).initialTimeStep();
        n_factor   *= n_cycle[i];
        dt_0        = std::min(dt_0,n_factor*dt_level[i]);
    }

    //
    // Limit dt's by the value of stop_time.
    //
    if (stop_time >= 0.0)
    {
        const Real eps      = 0.0001*dt_0;
        const Real cur_time = state[State_Type].curTime();
        if ((cur_time + dt_0) > (stop_time - eps))
            dt_0 = stop_time - cur_time;
    }

    n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        n_factor   *= n_cycle[i];
        dt_level[i] = dt_0/( (Real)n_factor );
    }
}